

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::InterfaceSchema> __thiscall
capnp::InterfaceSchema::findSuperclass(InterfaceSchema *this,uint64_t typeId)

{
  uint *in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX;
  Maybe<capnp::InterfaceSchema> MVar2;
  uint counter;
  uint64_t typeId_local;
  InterfaceSchema *this_local;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 aVar1;
  
  typeId_local = typeId;
  this_local = this;
  if (in_RDX == (uint *)0x3) {
    InterfaceSchema((InterfaceSchema *)&stack0xffffffffffffffd8);
    kj::Maybe<capnp::InterfaceSchema>::Maybe
              ((Maybe<capnp::InterfaceSchema> *)this,(InterfaceSchema *)&stack0xffffffffffffffd8);
    aVar1 = extraout_RDX;
  }
  else {
    MVar2 = findSuperclass(this,typeId,in_RDX);
    aVar1 = MVar2.ptr.field_1;
  }
  MVar2.ptr.field_1.field1 = aVar1.field1;
  MVar2.ptr._0_8_ = this;
  return (Maybe<capnp::InterfaceSchema>)MVar2.ptr;
}

Assistant:

kj::Maybe<InterfaceSchema> InterfaceSchema::findSuperclass(uint64_t typeId) const {
  if (typeId == _::NULL_INTERFACE_SCHEMA.id) {
    // We consider all interfaces to extend the null schema.
    return InterfaceSchema();
  }
  uint counter = 0;
  return findSuperclass(typeId, counter);
}